

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O3

void __thiscall Clasp::ClaspConfig::Impl::reset(Impl *this)

{
  size_type sVar1;
  
  sVar1 = (this->pp).ebo_.size;
  while (sVar1 != 0) {
    ConfiguratorProxy::destroy((this->pp).ebo_.buf + (sVar1 - 1));
    sVar1 = (this->pp).ebo_.size - 1;
    (this->pp).ebo_.size = sVar1;
  }
  return;
}

Assistant:

void ClaspConfig::Impl::reset() {
	for (; !pp.empty(); pp.pop_back()) { pp.back().destroy(); }
}